

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ptls_key_exchange_context_t **pppVar5;
  ushort *puVar6;
  long lVar7;
  anon_struct_72_2_510fbff9 *paVar8;
  ptls_cipher_suite_t *ppVar9;
  ptls_hash_context_t *ppVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  ushort *puVar14;
  ushort *puVar15;
  int iVar16;
  size_t __size;
  long lVar17;
  ulong uVar18;
  ptls_context_t *ppVar19;
  ulong uVar20;
  ptls_key_exchange_context_t *ppVar21;
  ptls_esni_context_t *ppVar22;
  bool bVar23;
  ushort *local_68;
  ptls_esni_context_t *local_60;
  ulong local_58;
  ptls_context_t *local_50;
  ushort *local_48;
  long local_40;
  ushort *local_38;
  
  uVar13 = esni_keys.len;
  puVar14 = (ushort *)esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  *(undefined8 *)&esni->padded_length = 0;
  esni->not_before = 0;
  esni->key_exchanges = (ptls_key_exchange_context_t **)0x0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  esni->not_after = 0;
  local_68 = puVar14;
  local_50 = ctx;
  pppVar5 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar5;
  if (pppVar5 == (ptls_key_exchange_context_t **)0x0) {
    iVar4 = 0x201;
  }
  else {
    memcpy(pppVar5,key_exchanges,__size);
    iVar4 = 0x33;
    if (5 < (long)uVar13) {
      puVar15 = (ushort *)((long)puVar14 + uVar13);
      local_68 = puVar14 + 3;
      iVar12 = 5;
      iVar4 = 0x32;
      if ((uVar13 & 0x7ffffffffffffffe) != 6) {
        lVar17 = 0;
        uVar20 = 0;
        do {
          uVar18 = uVar20 << 8;
          uVar20 = *(byte *)((long)local_68 + lVar17) | uVar18;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 2);
        local_68 = puVar14 + 4;
        if (uVar20 <= (ulong)((long)puVar15 - (long)local_68)) {
          puVar6 = (ushort *)((long)local_68 + uVar20);
          do {
            lVar17 = (long)puVar6 - (long)local_68;
            iVar4 = 0x32;
            if (1 < lVar17) {
              uVar18 = (ulong)(ushort)(*local_68 << 8 | *local_68 >> 8);
              local_68 = local_68 + 1;
              iVar4 = 0;
            }
            iVar12 = 5;
            if (1 < lVar17) {
              iVar4 = 0x32;
              if ((ulong)((long)puVar6 - (long)local_68) < 2) {
                bVar2 = false;
              }
              else {
                lVar17 = 0;
                uVar20 = 0;
                do {
                  uVar20 = (ulong)*(byte *)((long)local_68 + lVar17) | uVar20 << 8;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 2);
                local_68 = local_68 + 1;
                bVar2 = false;
                if (uVar20 <= (ulong)((long)puVar6 - (long)local_68)) {
                  local_68 = (ushort *)((long)local_68 + uVar20);
                  bVar2 = true;
                  iVar4 = 0;
                  iVar12 = 0;
                }
              }
              if (bVar2) {
                ppVar21 = *key_exchanges;
                pppVar5 = key_exchanges + 1;
                while ((iVar12 = 0, ppVar21 != (ptls_key_exchange_context_t *)0x0 &&
                       (iVar12 = 0, ppVar21->algo->id != (uint16_t)uVar18))) {
                  ppVar21 = *pppVar5;
                  pppVar5 = pppVar5 + 1;
                }
              }
            }
            if (iVar12 != 0) goto LAB_0010e631;
          } while (local_68 != puVar6);
          iVar12 = 0;
        }
      }
LAB_0010e631:
      if (iVar12 != 5) {
        if (iVar12 != 0) {
          return iVar4;
        }
        iVar4 = 0x32;
        local_38 = puVar14;
        cVar3 = '\x05';
        if (1 < (ulong)((long)puVar15 - (long)local_68)) {
          lVar17 = 0;
          uVar20 = 0;
          do {
            uVar20 = (ulong)*(byte *)((long)local_68 + lVar17) | uVar20 << 8;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 2);
          puVar14 = local_68 + 1;
          local_68 = puVar14;
          if (uVar20 <= (ulong)((long)puVar15 - (long)puVar14)) {
            puVar6 = (ushort *)((long)puVar14 + uVar20);
            lVar17 = 0;
            ppVar19 = local_50;
            ppVar22 = esni;
            local_60 = esni;
            local_58 = uVar13;
            local_48 = puVar15;
            do {
              lVar7 = (long)puVar6 - (long)puVar14;
              iVar12 = 0x32;
              if (1 < lVar7) {
                ppVar22 = (ptls_esni_context_t *)(ulong)(ushort)(*puVar14 << 8 | *puVar14 >> 8);
                puVar14 = puVar14 + 1;
                iVar12 = 0;
              }
              cVar11 = '\x05';
              bVar2 = false;
              if (1 < lVar7) {
                ppVar9 = *ppVar19->cipher_suites;
                bVar2 = true;
                bVar23 = ppVar9 == (ptls_cipher_suite_t *)0x0;
                if (!bVar23) {
                  if (ppVar9->id == (uint16_t)ppVar22) {
                    lVar7 = 0;
                  }
                  else {
                    lVar7 = 0;
                    do {
                      ppVar9 = ppVar19->cipher_suites[lVar7 + 1];
                      bVar23 = ppVar9 == (ptls_cipher_suite_t *)0x0;
                      if (bVar23) goto LAB_0010e720;
                      lVar7 = lVar7 + 1;
                    } while (ppVar9->id != (uint16_t)ppVar22);
                  }
                  if (!bVar23) {
                    local_40 = lVar17;
                    paVar8 = (anon_struct_72_2_510fbff9 *)
                             realloc(local_60->cipher_suites,(lVar17 * 8 + 8) * 9);
                    iVar12 = 0;
                    puVar15 = local_48;
                    ppVar19 = local_50;
                    if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) {
                      iVar12 = 0x201;
                      bVar2 = false;
                      cVar11 = '\x05';
                      lVar17 = local_40;
                    }
                    else {
                      local_60->cipher_suites = paVar8;
                      paVar8[local_40].cipher_suite = local_50->cipher_suites[lVar7];
                      cVar11 = '\0';
                      lVar17 = local_40 + 1;
                    }
                    goto LAB_0010e725;
                  }
                }
LAB_0010e720:
                iVar12 = 0;
                cVar11 = '\0';
              }
LAB_0010e725:
              esni = local_60;
              if (!bVar2) goto LAB_0010e821;
            } while (puVar14 != puVar6);
            local_68 = puVar14;
            paVar8 = (anon_struct_72_2_510fbff9 *)
                     realloc(local_60->cipher_suites,lVar17 * 0x48 + 0x48);
            puVar14 = local_68;
            if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) {
              cVar11 = '\x05';
              iVar12 = 0x201;
            }
            else {
              esni->cipher_suites = paVar8;
              paVar8[lVar17].cipher_suite = (ptls_cipher_suite_t *)0x0;
              cVar11 = '\0';
            }
LAB_0010e821:
            local_68 = puVar14;
            iVar4 = 0x32;
            if (local_68 == puVar6) {
              iVar4 = iVar12;
            }
            uVar13 = local_58;
            cVar3 = (local_68 != puVar6) * '\x05';
            if (cVar11 != '\0') {
              iVar4 = iVar12;
              cVar3 = cVar11;
            }
          }
        }
        if (cVar3 != '\x05') {
          if (cVar3 != '\0') {
            return iVar4;
          }
          iVar4 = 0x32;
          if (1 < (long)puVar15 - (long)local_68) {
            esni->padded_length = *local_68 << 8 | *local_68 >> 8;
            local_68 = local_68 + 1;
            iVar4 = ptls_decode64(&esni->not_before,(uint8_t **)&local_68,(uint8_t *)puVar15);
            if ((iVar4 == 0) &&
               (iVar4 = ptls_decode64(&esni->not_after,(uint8_t **)&local_68,(uint8_t *)puVar15),
               iVar4 == 0)) {
              iVar12 = 5;
              iVar16 = 0x32;
              if (1 < (ulong)((long)puVar15 - (long)local_68)) {
                lVar17 = 0;
                uVar20 = 0;
                do {
                  uVar20 = (ulong)*(byte *)((long)local_68 + lVar17) | uVar20 << 8;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 2);
                puVar14 = local_68 + 1;
                local_68 = puVar14;
                if (uVar20 <= (ulong)((long)puVar15 - (long)puVar14)) {
                  puVar6 = (ushort *)((long)puVar14 + uVar20);
                  if (puVar14 == puVar6) {
                    iVar16 = 0;
                  }
                  else {
                    do {
                      uVar20 = (ulong)((uint)(1 < (long)puVar6 - (long)puVar14) * 2);
                      local_68 = (ushort *)((long)puVar14 + uVar20);
                      iVar12 = 5;
                      iVar16 = 0x32;
                      if ((long)puVar6 - (long)puVar14 < 2) {
                        bVar2 = false;
                      }
                      else {
                        iVar16 = 0x32;
                        if ((ulong)((long)puVar6 - (long)local_68) < 2) {
                          bVar2 = false;
                        }
                        else {
                          lVar17 = 0;
                          uVar18 = 0;
                          do {
                            uVar18 = (ulong)*(byte *)((long)local_68 + lVar17) | uVar18 << 8;
                            lVar17 = lVar17 + 1;
                          } while (lVar17 != 2);
                          lVar17 = (long)puVar14 + uVar20 + 2;
                          bVar2 = uVar18 <= (ulong)((long)puVar6 - lVar17);
                          if (bVar2) {
                            local_68 = (ushort *)(lVar17 + uVar18);
                            iVar16 = 0;
                            iVar12 = 0;
                          }
                          else {
                            local_68 = (ushort *)((long)puVar14 + uVar20 + 2);
                          }
                        }
                      }
                      if (!bVar2) goto LAB_0010e9d5;
                      puVar14 = local_68;
                    } while (local_68 != puVar6);
                  }
                  iVar12 = 0;
                }
              }
LAB_0010e9d5:
              iVar4 = iVar16;
              if (iVar12 != 5) {
                if (iVar12 != 0) {
                  return 0;
                }
                iVar4 = 0x32;
                if (local_68 == puVar15) {
                  paVar8 = esni->cipher_suites;
                  ppVar9 = paVar8->cipher_suite;
                  local_58 = uVar13;
                  if (ppVar9 != (ptls_cipher_suite_t *)0x0) {
                    lVar17 = 0x48;
                    lVar7 = 0;
                    do {
                      ppVar10 = (*ppVar9->hash->create)();
                      if (ppVar10 == (ptls_hash_context_t *)0x0) {
                        iVar16 = 0x201;
                        iVar12 = 5;
                        goto LAB_0010ea89;
                      }
                      (*ppVar10->update)(ppVar10,local_38,local_58);
                      (*ppVar10->final)(ppVar10,paVar8->record_digest,PTLS_HASH_FINAL_MODE_FREE);
                      lVar7 = lVar7 + 1;
                      paVar8 = esni->cipher_suites + lVar7;
                      ppVar9 = *(ptls_cipher_suite_t **)
                                (esni->cipher_suites->record_digest + lVar17 + -8);
                      lVar17 = lVar17 + 0x48;
                    } while (ppVar9 != (ptls_cipher_suite_t *)0x0);
                    iVar16 = 0;
                  }
                  iVar12 = 0;
LAB_0010ea89:
                  iVar4 = iVar16;
                  if (iVar12 != 5) {
                    if (iVar12 != 0) {
                      return iVar16;
                    }
                    iVar4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (iVar4 != 0) {
    ptls_esni_dispose_context(esni);
  }
  return iVar4;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if (end - src < 6) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 6;
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}